

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

Error __thiscall asmjit::ZoneBitVector::_append(ZoneBitVector *this,ZoneHeap *heap,bool value)

{
  Error EVar1;
  long in_RDI;
  size_t idealCapacity;
  size_t newLength;
  size_t kThreshold;
  bool in_stack_00000067;
  size_t in_stack_00000068;
  size_t in_stack_00000070;
  ZoneHeap *in_stack_00000078;
  ZoneBitVector *in_stack_00000080;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  ulong local_30;
  
  local_30 = *(ulong *)(in_RDI + 0x10);
  if (local_30 < 0x80) {
    local_30 = 0x80;
  }
  else if (local_30 < 0x4000001) {
    local_30 = local_30 << 1;
  }
  else {
    local_30 = local_30 + 0x4000000;
  }
  if ((local_30 < *(ulong *)(in_RDI + 0x10)) &&
     (*(long *)(in_RDI + 8) + 1U <= *(ulong *)(in_RDI + 0x10))) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  EVar1 = _resize(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                  in_stack_00000067);
  return EVar1;
}

Assistant:

Error ZoneBitVector::_append(ZoneHeap* heap, bool value) noexcept {
  size_t kThreshold = Globals::kAllocThreshold * 8;
  size_t newLength = _length + 1;
  size_t idealCapacity = _capacity;

  if (idealCapacity < 128)
    idealCapacity = 128;
  else if (idealCapacity <= kThreshold)
    idealCapacity *= 2;
  else
    idealCapacity += kThreshold;

  if (ASMJIT_UNLIKELY(idealCapacity < _capacity)) {
    // It's technically impossible that `_length + 1` overflows.
    idealCapacity = newLength;
    ASMJIT_ASSERT(idealCapacity > _capacity);
  }

  return _resize(heap, newLength, idealCapacity, value);
}